

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::findOrInsert<QString>
          (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this,QString *key)

{
  bool bVar1;
  size_t in_RDX;
  Data<QHashPrivate::Node<QString,_QConfFile_*>_> *in_RSI;
  InsertionResult *in_RDI;
  long in_FS_OFFSET;
  Bucket BVar2;
  iterator iVar3;
  size_t in_stack_00000010;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *in_stack_00000018;
  size_t hash;
  Bucket it;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *in_stack_ffffffffffffff88;
  InsertionResult *this_00;
  Data<QHashPrivate::Node<QString,_QConfFile_*>_> *key_00;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *in_stack_ffffffffffffffc8;
  undefined1 *local_30;
  Span *local_28;
  undefined1 *local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  key_00 = in_RSI;
  Bucket::Bucket(&local_18,(Span *)0x0,0);
  calculateHash<QString>((QString *)this_00,(size_t)in_stack_ffffffffffffff88);
  if (*(long *)(in_RSI + 0x10) != 0) {
    BVar2 = findBucketWithHash<QString>(in_stack_ffffffffffffffc8,(QString *)key_00,in_RDX);
    local_28 = BVar2.span;
    local_18.span = local_28;
    local_20 = (undefined1 *)BVar2.index;
    local_18.index = (size_t)local_20;
    bVar1 = Bucket::isUnused((Bucket *)0x7bff1d);
    if (!bVar1) {
      iVar3 = Bucket::toIterator((Bucket *)this_00,in_stack_ffffffffffffff88);
      this_00->it = iVar3;
      this_00->initialized = true;
      goto LAB_007bffd9;
    }
  }
  bVar1 = shouldGrow(in_RSI);
  if (bVar1) {
    rehash(in_stack_00000018,in_stack_00000010);
    BVar2 = findBucketWithHash<QString>(in_stack_ffffffffffffffc8,(QString *)key_00,in_RDX);
    local_18.span = BVar2.span;
    local_30 = (undefined1 *)BVar2.index;
    local_18.index = (size_t)local_30;
  }
  Bucket::insert((Bucket *)0x7bffa9);
  *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
  iVar3 = Bucket::toIterator((Bucket *)this_00,in_stack_ffffffffffffff88);
  this_00->it = iVar3;
  this_00->initialized = false;
LAB_007bffd9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }